

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_val(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  long *plVar2;
  undefined4 *puVar3;
  Value val;
  undefined1 local_68 [16];
  long *local_58;
  char local_50;
  Value local_48;
  Value local_38;
  String local_28;
  
  local_50 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001bf0d8;
  plVar2[3] = 5;
  plVar2[4] = -1;
  puVar3 = (undefined4 *)operator_new__(5);
  plVar2[2] = (long)puVar3;
  *(undefined1 *)(puVar3 + 1) = 0;
  *puVar3 = 0x666c6573;
  local_58 = plVar2;
  Context::GetVar((Context *)local_68,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar2 = local_58 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  if (local_68[0] == 3) {
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_68._8_8_ !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      plVar2 = &((RefCountedStorage *)local_68._8_8_)->refCount;
      *plVar2 = *plVar2 + 1;
    }
    local_28.ss = (StringStorage *)local_68._8_8_;
    local_28.isTemp = false;
    local_48.data.number = String::DoubleValue(&local_28,"%lf");
    local_48.type = Number;
    local_48.noInvoke = false;
    local_48.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_48);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_48.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_48.data.number = 0.0;
    }
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_28.ss !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_28.isTemp == false)) {
      plVar2 = &((local_28.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_28.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
    }
  }
  else if (local_68[0] == 1) {
    local_38.type = Number;
    local_38.noInvoke = (bool)local_68[1];
    local_38.localOnly = local_68[2];
    local_38.data.ref = (RefCountedStorage *)local_68._8_8_;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_38);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_38.type) &&
       ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_38.data.ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
      plVar2 = &(local_38.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((RefCountedStorage *)&(local_38.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_38.data.number = 0.0;
    }
  }
  else {
    IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
    pLVar1 = IntrinsicResult::Null;
    (context->code).ls = IntrinsicResult::Null;
    if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar2 = &(pLVar1->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + 1;
    }
  }
  if ((2 < local_68[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_68._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar2 = &((RefCountedStorage *)local_68._8_8_)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)local_68._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_val(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::Number) return IntrinsicResult(val);
		if (val.type == ValueType::String) return IntrinsicResult(val.GetString().DoubleValue());
		return IntrinsicResult::Null;
	}